

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_string_delete_property(JSContext *ctx,JSValue obj,JSAtom prop)

{
  uint uVar1;
  
  if ((int)prop < 0) {
    uVar1 = 0;
    if (*(int *)((long)obj.u.ptr + 0x38) == -7) {
      uVar1 = *(uint *)(*(long *)((long)obj.u.ptr + 0x30) + 4) & 0x7fffffff;
    }
    if ((prop & 0x7fffffff) < uVar1) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int js_string_delete_property(JSContext *ctx,
                                     JSValueConst obj, JSAtom prop)
{
    uint32_t idx;

    if (__JS_AtomIsTaggedInt(prop)) {
        idx = __JS_AtomToUInt32(prop);
        if (idx < js_string_obj_get_length(ctx, obj)) {
            return FALSE;
        }
    }
    return TRUE;
}